

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O0

iterator __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
::find<google::protobuf::(anonymous_namespace)::ParentNumberQuery>
          (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
           *this,key_arg<google::protobuf::(anonymous_namespace)::ParentNumberQuery> *key)

{
  bool bVar1;
  hasher *this_00;
  size_t hash;
  key_arg<google::protobuf::(anonymous_namespace)::ParentNumberQuery> *key_local;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
  *this_local;
  
  AssertOnFind<google::protobuf::(anonymous_namespace)::ParentNumberQuery>(this,key);
  bVar1 = is_soo(this);
  if (bVar1) {
    _this_local = find_soo<google::protobuf::(anonymous_namespace)::ParentNumberQuery>(this,key);
  }
  else {
    prefetch_heap_block(this);
    this_00 = hash_ref(this);
    hash = google::protobuf::(anonymous_namespace)::ParentNumberHash::operator()
                     ((ParentNumberHash *)this_00,key);
    _this_local = find_non_soo<google::protobuf::(anonymous_namespace)::ParentNumberQuery>
                            (this,key,hash);
  }
  return _this_local;
}

Assistant:

iterator find(const key_arg<K>& key) ABSL_ATTRIBUTE_LIFETIME_BOUND {
    AssertOnFind(key);
    if (is_soo()) return find_soo(key);
    prefetch_heap_block();
    return find_non_soo(key, hash_ref()(key));
  }